

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall Node::AddValidationOutEdge(Node *this,Edge *edge)

{
  pointer *pppEVar1;
  iterator __position;
  Edge *local_8;
  
  __position._M_current =
       (this->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = edge;
    std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>
              ((vector<Edge*,std::allocator<Edge*>> *)&this->validation_out_edges_,__position,
               &local_8);
  }
  else {
    *__position._M_current = edge;
    pppEVar1 = &(this->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  return;
}

Assistant:

void AddValidationOutEdge(Edge* edge) { validation_out_edges_.push_back(edge); }